

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::LogOpcode
          (BinaryReaderObjdumpDisassemble *this,char *fmt,...)

{
  uint uVar1;
  Offset OVar2;
  bool bVar3;
  char in_AL;
  Enum EVar4;
  size_t sVar5;
  ulong uVar6;
  Offset OVar7;
  size_type sVar8;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  ulong local_90;
  Offset abs_offset;
  Offset code_start;
  Reloc *reloc;
  va_list args;
  char *opcode_name;
  int j;
  int indent_level;
  size_t i;
  bool first_line;
  Offset offset_end;
  Offset offset;
  Offset total_size;
  Offset opcode_size;
  Offset immediate_len;
  char *fmt_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  local_138 = in_RDX;
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  if ((this->in_function_body & 1U) == 0) {
    __assert_fail("in_function_body",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-objdump.cc"
                  ,0x295,
                  "void wabt::(anonymous namespace)::BinaryReaderObjdumpDisassemble::LogOpcode(const char *, ...)"
                 );
  }
  if ((this->skip_next_opcode_ & 1U) == 0) {
    OVar7 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
            state)->offset;
    OVar2 = this->current_opcode_offset;
    sVar5 = Opcode::GetLength(&(this->super_BinaryReaderObjdumpBase).current_opcode);
    offset_end = this->current_opcode_offset - sVar5;
    uVar6 = offset_end + sVar5 + (OVar7 - OVar2);
    bVar3 = true;
    while (offset_end < uVar6) {
      OVar7 = anon_unknown_16::BinaryReaderObjdumpBase::GetPrintOffset
                        (&this->super_BinaryReaderObjdumpBase,offset_end);
      printf(" %06zx:",OVar7);
      _j = 0;
      for (; offset_end < uVar6 && _j < 9; offset_end = offset_end + 1) {
        printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[offset_end]);
        _j = _j + 1;
      }
      for (; _j < 9; _j = _j + 1) {
        printf("   ");
      }
      printf(" | ");
      if (bVar3) {
        bVar3 = false;
        opcode_name._4_4_ = this->indent_level;
        EVar4 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode)
        ;
        if (((EVar4 == Else) || (EVar4 == Catch)) || (EVar4 == CatchAll)) {
          opcode_name._4_4_ = opcode_name._4_4_ + -1;
        }
        for (opcode_name._0_4_ = 0; (int)opcode_name < opcode_name._4_4_;
            opcode_name._0_4_ = (int)opcode_name + 1) {
          printf("  ");
        }
        args[0].reg_save_area =
             Opcode::GetName(&(this->super_BinaryReaderObjdumpBase).current_opcode);
        printf("%s",args[0].reg_save_area);
        if (fmt != (char *)0x0) {
          printf(" ");
          args[0].overflow_arg_area = local_148;
          args[0]._0_8_ = &stack0x00000008;
          reloc._4_4_ = 0x30;
          reloc._0_4_ = 0x10;
          vprintf(fmt,&reloc);
        }
      }
      printf("\n");
    }
    this->last_opcode_end =
         ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
         state)->offset;
    if (((((this->super_BinaryReaderObjdumpBase).options_)->relocs & 1U) != 0) &&
       (uVar1 = this->next_reloc,
       sVar8 = std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::size
                         (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->code_relocations)
       , uVar1 < sVar8)) {
      code_start = (Offset)std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::operator[]
                                     (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                                       code_relocations,(ulong)this->next_reloc);
      abs_offset = anon_unknown_16::BinaryReaderObjdumpBase::GetSectionStart
                             (&this->super_BinaryReaderObjdumpBase,Code);
      local_90 = abs_offset + *(long *)(code_start + 8);
      if (local_90 < this->last_opcode_end) {
        anon_unknown_16::BinaryReaderObjdumpBase::PrintRelocation
                  (&this->super_BinaryReaderObjdumpBase,(Reloc *)code_start,local_90);
        this->next_reloc = this->next_reloc + 1;
      }
    }
  }
  else {
    this->skip_next_opcode_ = false;
  }
  return;
}

Assistant:

void BinaryReaderObjdumpDisassemble::LogOpcode(const char* fmt, ...) {
  // BinaryReaderObjdumpDisassemble is only used to disassembly function bodies
  // so this should never be called for instructions outside of function bodies
  // (i.e. init expresions).
  assert(in_function_body);
  if (skip_next_opcode_) {
    skip_next_opcode_ = false;
    return;
  }
  const Offset immediate_len = state->offset - current_opcode_offset;
  const Offset opcode_size = current_opcode.GetLength();
  const Offset total_size = opcode_size + immediate_len;
  // current_opcode_offset has already read past this opcode; rewind it by the
  // size of this opcode, which may be more than one byte.
  Offset offset = current_opcode_offset - opcode_size;
  const Offset offset_end = offset + total_size;

  bool first_line = true;
  while (offset < offset_end) {
    // Print bytes, but only display a maximum of IMMEDIATE_OCTET_COUNT on each
    // line.
    printf(" %06" PRIzx ":", GetPrintOffset(offset));
    size_t i;
    for (i = 0; offset < offset_end && i < IMMEDIATE_OCTET_COUNT;
         ++i, ++offset) {
      printf(" %02x", data_[offset]);
    }
    // Fill the rest of the remaining space with spaces.
    for (; i < IMMEDIATE_OCTET_COUNT; ++i) {
      printf("   ");
    }
    printf(" | ");

    if (first_line) {
      first_line = false;

      // Print disassembly.
      int indent_level = this->indent_level;
      switch (current_opcode) {
        case Opcode::Else:
        case Opcode::Catch:
        case Opcode::CatchAll:
          indent_level--;
          break;
        default:
          break;
      }
      for (int j = 0; j < indent_level; j++) {
        printf("  ");
      }

      const char* opcode_name = current_opcode.GetName();
      printf("%s", opcode_name);
      if (fmt) {
        printf(" ");
        va_list args;
        va_start(args, fmt);
        vprintf(fmt, args);
        va_end(args);
      }
    }

    printf("\n");
  }

  last_opcode_end = state->offset;

  // Print relocation after then full (potentially multi-line) instruction.
  if (options_->relocs &&
      next_reloc < objdump_state_->code_relocations.size()) {
    const Reloc& reloc = objdump_state_->code_relocations[next_reloc];
    Offset code_start = GetSectionStart(BinarySection::Code);
    Offset abs_offset = code_start + reloc.offset;
    if (last_opcode_end > abs_offset) {
      PrintRelocation(reloc, abs_offset);
      next_reloc++;
    }
  }
}